

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaAllocation_T::DedicatedAllocMap(VmaAllocation_T *this,VmaAllocator hAllocator,void **ppData)

{
  VkResult VVar1;
  uint8_t uVar2;
  
  uVar2 = this->m_MapCount;
  if (uVar2 == 0xff) {
    return VK_ERROR_MEMORY_MAP_FAILED;
  }
  if ((uVar2 == '\0') && ((this->m_Flags & 1) == 0)) {
    VVar1 = (*(hAllocator->m_VulkanFunctions).vkMapMemory)
                      (hAllocator->m_hDevice,(this->field_0).m_DedicatedAllocation.m_hMemory,0,
                       0xffffffffffffffff,0,ppData);
    if (VVar1 != VK_SUCCESS) {
      return VVar1;
    }
    (this->field_0).m_DedicatedAllocation.m_pMappedData = *ppData;
    uVar2 = '\x01';
  }
  else {
    *ppData = (this->field_0).m_DedicatedAllocation.m_pMappedData;
    uVar2 = uVar2 + '\x01';
  }
  this->m_MapCount = uVar2;
  return VK_SUCCESS;
}

Assistant:

VkResult VmaAllocation_T::DedicatedAllocMap(VmaAllocator hAllocator, void** ppData)
{
    VMA_ASSERT(GetType() == ALLOCATION_TYPE_DEDICATED);
    VMA_ASSERT(IsMappingAllowed() && "Mapping is not allowed on this allocation! Please use one of the new VMA_ALLOCATION_CREATE_HOST_ACCESS_* flags when creating it.");

    if (m_MapCount != 0 || IsPersistentMap())
    {
        if (m_MapCount < 0xFF)
        {
            VMA_ASSERT(m_DedicatedAllocation.m_pMappedData != VMA_NULL);
            *ppData = m_DedicatedAllocation.m_pMappedData;
            ++m_MapCount;
            return VK_SUCCESS;
        }
        else
        {
            VMA_ASSERT(0 && "Dedicated allocation mapped too many times simultaneously.");
            return VK_ERROR_MEMORY_MAP_FAILED;
        }
    }
    else
    {
        VkResult result = (*hAllocator->GetVulkanFunctions().vkMapMemory)(
            hAllocator->m_hDevice,
            m_DedicatedAllocation.m_hMemory,
            0, // offset
            VK_WHOLE_SIZE,
            0, // flags
            ppData);
        if (result == VK_SUCCESS)
        {
            m_DedicatedAllocation.m_pMappedData = *ppData;
            m_MapCount = 1;
        }
        return result;
    }
}